

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

uint __thiscall lsh::vector::hash(vector *this)

{
  size_type sVar1;
  const_reference pvVar2;
  size_t sVar3;
  uint local_28;
  hash<unsigned_int> local_21;
  uint i;
  hash<unsigned_int> hasher;
  unsigned_long h;
  uint n;
  vector *this_local;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->components_);
  _i = 0;
  for (local_28 = 0; local_28 < (uint)sVar1; local_28 = local_28 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->components_,(ulong)local_28);
    sVar3 = std::hash<unsigned_int>::operator()(&local_21,*pvVar2);
    _i = sVar3 + _i * 0x40 + (_i >> 2) ^ _i;
  }
  return (uint)_i ^ (uint)(_i >> 0x20);
}

Assistant:

unsigned int vector::hash() const {
    unsigned int n = this->components_.size();

    unsigned long h = 0;

    std::hash<unsigned int> hasher;

    for (unsigned int i = 0; i < n; i++) {
      h ^= hasher(this->components_[i]) + (h << 6) + (h >> 2);
    }

    return h ^ (h >> (sizeof(unsigned int) * 8));
  }